

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O0

void getmaxdepth(btDbvtNode *node,int depth,int *maxdepth)

{
  bool bVar1;
  int *piVar2;
  int *in_RDX;
  int in_ESI;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = btDbvtNode::isinternal((btDbvtNode *)0x15e79b);
  if (bVar1) {
    getmaxdepth((btDbvtNode *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (int)((ulong)in_RDX >> 0x20),(int *)0x15e7ba);
    getmaxdepth((btDbvtNode *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (int)((ulong)in_RDX >> 0x20),(int *)0x15e7d3);
  }
  else {
    piVar2 = btMax<int>(in_RDX,(int *)&stack0xfffffffffffffff4);
    *in_RDX = *piVar2;
  }
  return;
}

Assistant:

static void						getmaxdepth(const btDbvtNode* node,int depth,int& maxdepth)
{
	if(node->isinternal())
	{
		getmaxdepth(node->childs[0],depth+1,maxdepth);
		getmaxdepth(node->childs[1],depth+1,maxdepth);
	} else maxdepth=btMax(maxdepth,depth);
}